

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O0

void * obuf_alloc_pos(obuf *buf,size_t size)

{
  int iVar1;
  slab *slab_00;
  void *pvVar2;
  size_t sVar3;
  slab *local_40;
  slab *slab;
  size_t capacity;
  int pos;
  size_t size_local;
  obuf *buf_local;
  
  iVar1 = buf->pos;
  if ((buf->capacity[iVar1] != 0) || (buf->iov[iVar1].iov_len != 0)) {
    __assert_fail("buf->capacity[pos] == 0 && buf->iov[pos].iov_len == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                  ,0x29,"void *obuf_alloc_pos(struct obuf *, size_t)");
  }
  if (0x1e < iVar1) {
    __assert_fail("pos < SMALL_OBUF_IOV_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                  ,0x2a,"void *obuf_alloc_pos(struct obuf *, size_t)");
  }
  if (buf->n_iov == iVar1) {
    buf->iov[iVar1 + 1].iov_base = buf->iov[iVar1].iov_base;
    buf->iov[iVar1 + 1].iov_len = buf->iov[iVar1].iov_len;
    buf->capacity[iVar1 + 1] = buf->capacity[iVar1];
    slab = (slab *)(buf->start_capacity << ((byte)iVar1 & 0x3f));
    while (slab < size) {
      if (slab == (slab *)0x0) {
        local_40 = (slab *)buf->start_capacity;
      }
      else {
        local_40 = (slab *)((long)slab << 1);
      }
      slab = local_40;
    }
    slab_00 = slab_get(buf->slabc,(size_t)slab);
    if (slab_00 == (slab *)0x0) {
      buf_local = (obuf *)0x0;
    }
    else {
      pvVar2 = slab_data(slab_00);
      buf->iov[iVar1].iov_base = pvVar2;
      sVar3 = slab_capacity(slab_00);
      buf->capacity[iVar1] = sVar3;
      buf->n_iov = buf->n_iov + 1;
      buf_local = (obuf *)buf->iov[iVar1].iov_base;
    }
    return buf_local;
  }
  __assert_fail("buf->n_iov == pos",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c",
                0x2b,"void *obuf_alloc_pos(struct obuf *, size_t)");
}

Assistant:

static inline void *
obuf_alloc_pos(struct obuf *buf, size_t size)
{
	int pos = buf->pos;
	assert(buf->capacity[pos] == 0 && buf->iov[pos].iov_len == 0);
	assert(pos < SMALL_OBUF_IOV_MAX);
	assert(buf->n_iov == pos);
	/** Initialize the next pos. */
	buf->iov[pos+1] = buf->iov[pos];
	buf->capacity[pos+1] = buf->capacity[pos];
	size_t capacity = buf->start_capacity << pos;
	while (capacity < size) {
		capacity = capacity == 0 ? buf->start_capacity: capacity * 2;
	}
	struct slab *slab = slab_get(buf->slabc, capacity);
	if (slab == NULL)
		return NULL;
	buf->iov[pos].iov_base = slab_data(slab);
	buf->capacity[pos] = slab_capacity(slab);
	buf->n_iov++;
	return buf->iov[pos].iov_base;
}